

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

bool NextCycle(int newCycle)

{
  bool bVar1;
  int iVar2;
  logLevelTy lVar3;
  int in_EDI;
  double dVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffffc;
  
  if (currCycle.num < 0) {
    prevCycle.num = in_EDI + -1;
    dVar4 = DataRefs::GetSimTime(&dataRefs);
    prevCycle.simTime = dVar4 - 0.1;
    currCycle.num = in_EDI;
  }
  else {
    prevCycle._4_4_ = currCycle._4_4_;
    prevCycle.num = currCycle.num;
    prevCycle.simTime = currCycle.simTime;
    prevCycle.diffTime = currCycle.diffTime;
    currCycle.num = in_EDI;
  }
  iVar5 = currCycle.num;
  currCycle.simTime = DataRefs::GetSimTime(&dataRefs);
  currCycle.diffTime = currCycle.simTime - prevCycle.simTime;
  iVar2 = DataRefs::GetNumAc(&dataRefs);
  dVar4 = currCycle.diffTime;
  if (iVar2 < 1) {
LAB_0018c120:
    LTRegularUpdates();
    bVar1 = DataRefs::ShallDrawLabels((DataRefs *)CONCAT44(in_stack_fffffffffffffffc,iVar5));
    if (bVar1) {
      XPMPEnableAircraftLabels(false);
    }
    else {
      XPMPDisableAircraftLabels();
    }
    bVar1 = true;
  }
  else {
    if (0.0 <= currCycle.diffTime) {
      iVar2 = DataRefs::GetFdBufPeriod(&dataRefs);
      if (dVar4 <= (double)iVar2) goto LAB_0018c120;
    }
    DataRefs::SetReInitAll(&dataRefs,true);
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 3) {
      LogMsg((char *)currCycle.diffTime,0x389ead,(char *)0x75,0x389f08,(char *)0x2,
             "Time moved non-linear/jumped by %.1f seconds, will re-init aircraft.");
    }
    CreateMsgWindow(8.0,(logLevelTy)currCycle.diffTime,(char *)0x2,
                    "Time moved non-linear/jumped by %.1f seconds, will re-init aircraft.");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool NextCycle (int newCycle)
{
    if ( currCycle.num >= 0 )    // not the very very first cycle?
        prevCycle = currCycle;
    else
    {
        prevCycle.num = newCycle-1;
        prevCycle.simTime  = dataRefs.GetSimTime() - 0.1;
#ifdef DEBUG
        // initialize frame lengths with 30 FPS
        gFrameLen.fill(1/30.0);
        gFrameLenIter = gFrameLen.begin();
#endif
    }
    currCycle.num = newCycle;
    currCycle.simTime  = dataRefs.GetSimTime();
    
    // the time that has passed since the last cycle
    currCycle.diffTime  = currCycle.simTime - prevCycle.simTime;

#ifdef DEBUG
    // When debugging we want to step through the data and don't mind if
    // we de-synch with reality, so if we notice too long a wait between
    // frames we assume some debugging delay and instead increase buffering time
    if (dataRefs.GetNumAc() > 0)
    {
        if (currCycle.diffTime < 0) {
            // jumped backward...that has nothing to do with debugging
            dataRefs.SetReInitAll(true);
            SHOW_MSG(logWARN, ERR_TIME_NONLINEAR, currCycle.diffTime);
            return false;
        }
        // test for forward movement of time, which here we assume is due to debugging
        else if (currCycle.diffTime > 1.0) {
            const double avgFrameLen = std::accumulate(gFrameLen.cbegin(), gFrameLen.cend(), 0.0) / gFrameLen.size();
            dataRefs.fdBufDebug += currCycle.diffTime;      // increase buffering period by wait time
            dataRefs.fdBufDebug -= avgFrameLen;             // minus an average frame length
            
            // And fix this cycle
            dataRefs.UpdateSimTime();                       // recalc simTime based on fdBufDebug
            currCycle.simTime  = dataRefs.GetSimTime();
            currCycle.diffTime = currCycle.simTime - prevCycle.simTime; // should be about avgFrameLen now
        }
        // otherwise all good, store our frame time
        else {
            *gFrameLenIter = currCycle.diffTime;
            if ((++gFrameLenIter) == gFrameLen.end())
                gFrameLenIter = gFrameLen.begin();
        }
    }
#else
    // time should move forward (positive difference) and not too much either
    // If time moved to far between two calls then we better start over
    // (but no problem if no a/c yet displayed anyway)
    if (dataRefs.GetNumAc() > 0 &&
        (currCycle.diffTime < 0 || currCycle.diffTime > dataRefs.GetFdBufPeriod()) ) {
        // too much time passed...we start over and reinit all aircraft
        dataRefs.SetReInitAll(true);
        SHOW_MSG(logWARN, ERR_TIME_NONLINEAR, currCycle.diffTime);
        return false;
    }
#endif
    
    // All regular updates are collected here
    LTRegularUpdates();
    
    // tell multiplayer lib if we want to see labels
    // (these are very quick calls only setting a variable)
    // as the user can change between views any frame
    // Tell XPMP if we need labels
    if (dataRefs.ShallDrawLabels())
        XPMPEnableAircraftLabels();
    else
        XPMPDisableAircraftLabels();
    
    return true;
}